

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O0

void Imf_3_4::saveDeepScanLineImage
               (string *fileName,Header *hdr,DeepImage *img,DataWindowSource dws)

{
  bool bVar1;
  int iVar2;
  Attribute *pAVar3;
  undefined4 *puVar4;
  string *psVar5;
  string *psVar6;
  DeepImageChannel *pDVar7;
  char *pcVar8;
  long *in_RDX;
  undefined1 auVar9 [16];
  DeepScanLineOutputFile out;
  ConstIterator i_1;
  DeepFrameBuffer fb;
  DeepImageLevel *level;
  ConstIterator i;
  Header newHdr;
  DeepImageLevel *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  ImageChannel *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  SampleCountChannel *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  Header *in_stack_fffffffffffffdd8;
  DeepFrameBuffer local_1b0;
  const_iterator local_148;
  const_iterator local_140;
  Slice local_100 [104];
  DeepImageLevel *local_98;
  undefined8 local_80;
  undefined8 local_68;
  Vec2<float> local_60;
  Header local_58 [64];
  long *local_18;
  
  local_18 = in_RDX;
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_4::Header::Header((Header *)0x3f800000,local_58,0x40,0x40,&local_60,0,3);
  local_68 = Imf_3_4::Header::begin();
  while( true ) {
    local_80 = Imf_3_4::Header::end();
    bVar1 = operator!=((ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       (ConstIterator *)in_stack_fffffffffffffd68);
    if (!bVar1) break;
    pcVar8 = Header::ConstIterator::name((ConstIterator *)0x12604a);
    iVar2 = strcmp(pcVar8,"dataWindow");
    if (iVar2 != 0) {
      pcVar8 = Header::ConstIterator::name((ConstIterator *)0x12607e);
      iVar2 = strcmp(pcVar8,"tiles");
      if (iVar2 != 0) {
        pcVar8 = Header::ConstIterator::name((ConstIterator *)0x1260b2);
        iVar2 = strcmp(pcVar8,"channels");
        if (iVar2 != 0) {
          pAVar3 = (Attribute *)Header::ConstIterator::name((ConstIterator *)0x1260e2);
          Header::ConstIterator::attribute((ConstIterator *)0x1260f9);
          Imf_3_4::Header::insert((char *)local_58,pAVar3);
        }
      }
    }
    Header::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  }
  dataWindowForFile(in_stack_fffffffffffffdd8,
                    (Image *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                    (DataWindowSource)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffd68);
  puVar4 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar4 = 2;
  local_98 = (DeepImageLevel *)(**(code **)(*local_18 + 0x20))(local_18,0);
  DeepFrameBuffer::DeepFrameBuffer
            ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  DeepImageLevel::sampleCounts(local_98);
  SampleCountChannel::slice(in_stack_fffffffffffffdb0);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_100);
  local_140._M_node = (_Base_ptr)DeepImageLevel::begin(in_stack_fffffffffffffd68);
  while( true ) {
    local_148._M_node = (_Base_ptr)DeepImageLevel::end(in_stack_fffffffffffffd68);
    bVar1 = operator!=((ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       (ConstIterator *)in_stack_fffffffffffffd68);
    if (!bVar1) break;
    psVar5 = (string *)Imf_3_4::Header::channels();
    psVar6 = DeepImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x1262d6);
    DeepImageLevel::ConstIterator::channel((ConstIterator *)0x1262ea);
    auVar9 = ImageChannel::channel(in_stack_fffffffffffffd80);
    local_1b0._72_5_ = auVar9._0_5_;
    local_1b0._77_3_ = auVar9._5_3_;
    local_1b0._80_5_ = auVar9._8_5_;
    local_1b0._85_3_ = auVar9._13_3_;
    local_1b0._96_5_ = local_1b0._80_5_;
    local_1b0._88_5_ = local_1b0._72_5_;
    local_1b0._93_3_ = local_1b0._77_3_;
    Imf_3_4::ChannelList::insert(psVar5,(Channel *)psVar6);
    psVar6 = DeepImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x126367);
    pDVar7 = DeepImageLevel::ConstIterator::channel((ConstIterator *)0x12637b);
    (*(pDVar7->super_ImageChannel)._vptr_ImageChannel[4])
              (&local_1b0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    Imf_3_4::DeepFrameBuffer::insert((string *)local_100,(DeepSlice *)psVar6);
    DeepImageLevel::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  }
  pcVar8 = (char *)std::__cxx11::string::c_str();
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
            ((DeepScanLineOutputFile *)&local_1b0,pcVar8,local_58,iVar2);
  Imf_3_4::DeepScanLineOutputFile::setFrameBuffer(&local_1b0);
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::DeepScanLineOutputFile::writePixels((int)&local_1b0);
  Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile((DeepScanLineOutputFile *)&local_1b0);
  DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1264a6);
  Imf_3_4::Header::~Header(local_58);
  return;
}

Assistant:

void
saveDeepScanLineImage (
    const string&    fileName,
    const Header&    hdr,
    const DeepImage& img,
    DataWindowSource dws)
{
    Header newHdr;

    for (Header::ConstIterator i = hdr.begin (); i != hdr.end (); ++i)
    {
        if (strcmp (i.name (), "dataWindow") && strcmp (i.name (), "tiles") &&
            strcmp (i.name (), "channels"))
        {
            newHdr.insert (i.name (), i.attribute ());
        }
    }

    newHdr.dataWindow () = dataWindowForFile (hdr, img, dws);

    //XXX TODO: setting the compression to, for example,  ZIP_COMPRESSION,
    //then the OpenEXR library will save the file, but later it will not be
    //able to read it.  Fix the library!

    newHdr.compression () = ZIPS_COMPRESSION;

    const DeepImageLevel& level = img.level ();
    DeepFrameBuffer       fb;

    fb.insertSampleCountSlice (level.sampleCounts ().slice ());

    for (DeepImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
    {
        newHdr.channels ().insert (i.name (), i.channel ().channel ());
        fb.insert (i.name (), i.channel ().slice ());
    }

    DeepScanLineOutputFile out (fileName.c_str (), newHdr);
    out.setFrameBuffer (fb);
    out.writePixels (
        newHdr.dataWindow ().max.y - newHdr.dataWindow ().min.y + 1);
}